

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O2

void __thiscall
Assimp::LWO::AnimResolver::GetKeys
          (AnimResolver *this,vector<aiVectorKey,_std::allocator<aiVectorKey>_> *out,
          Envelope *_envl_x,Envelope *_envl_y,Envelope *_envl_z,uint _flags)

{
  double dVar1;
  double dVar2;
  Envelope *pEVar3;
  double dVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pKVar7;
  pointer paVar8;
  pointer pKVar9;
  pointer pKVar10;
  pointer pKVar11;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> *out_00;
  undefined4 uVar12;
  undefined4 uVar13;
  aiVectorKey fill;
  value_type local_110;
  Envelope local_e8;
  Envelope local_a8;
  Envelope local_68;
  
  this->envl_x = _envl_x;
  this->envl_y = _envl_y;
  this->envl_z = _envl_z;
  this->flags = _flags;
  local_68.index = 0;
  local_68.type = EnvelopeType_Unknown;
  local_68.pre = PrePostBehaviour_Constant;
  local_68.post = PrePostBehaviour_Constant;
  local_68.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.old_last = 0;
  local_68.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.old_first = 0;
  local_a8.index = 0;
  local_a8.type = EnvelopeType_Unknown;
  local_a8.pre = PrePostBehaviour_Constant;
  local_a8.post = PrePostBehaviour_Constant;
  local_a8.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.old_first = 0;
  local_a8.old_last = 0;
  local_e8.index = 0;
  local_e8.type = EnvelopeType_Unknown;
  local_e8.pre = PrePostBehaviour_Constant;
  local_e8.post = PrePostBehaviour_Constant;
  local_e8.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.old_first = 0;
  local_e8.old_last = 0;
  local_110.inter = IT_LINE;
  local_110.params[0] = 0.0;
  local_110.params[1] = 0.0;
  local_110.params[2] = 0.0;
  local_110.params[3] = 0.0;
  local_110.params[4] = 0.0;
  local_110.time = 0.0;
  if ((_envl_x == (Envelope *)0x0) || (_envl_x->type != EnvelopeType_Scaling_X)) {
    if (((_envl_y == (Envelope *)0x0) || (_envl_y->type != EnvelopeType_Scaling_Y)) &&
       ((_envl_z == (Envelope *)0x0 || (_envl_z->type != EnvelopeType_Scaling_Z)))) {
      local_110.value = 0.0;
    }
    else {
      local_110.value = 1.0;
    }
    if (_envl_x == (Envelope *)0x0) {
      this->envl_x = &local_68;
      std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::push_back
                (&local_68.keys,&local_110);
      _envl_y = this->envl_y;
    }
  }
  else {
    local_110.value = 1.0;
  }
  if (_envl_y == (Envelope *)0x0) {
    this->envl_y = &local_a8;
    std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::push_back
              (&local_a8.keys,&local_110);
  }
  if (this->envl_z == (Envelope *)0x0) {
    this->envl_z = &local_e8;
    std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::push_back
              (&local_e8.keys,&local_110);
  }
  if ((this->flags & 1) == 0) {
    uVar5 = ((long)(this->envl_x->keys).
                   super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(this->envl_x->keys).
                  super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x28;
    uVar6 = ((long)(this->envl_z->keys).
                   super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(this->envl_z->keys).
                  super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x28;
    if (uVar6 < uVar5) {
      uVar6 = uVar5;
    }
  }
  else {
    uVar6 = -(ulong)(this->sample_rate != 0.0);
    dVar4 = (double)(~uVar6 & 0x4059000000000000 | (ulong)this->sample_rate & uVar6);
    this->sample_delta = 1.0 / dVar4;
    dVar1 = (this->envl_z->keys).
            super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].time;
    uVar12 = SUB84(dVar1,0);
    uVar13 = (undefined4)((ulong)dVar1 >> 0x20);
    dVar2 = (this->envl_y->keys).
            super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].time;
    if (dVar1 <= dVar2) {
      uVar12 = SUB84(dVar2,0);
      uVar13 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    dVar1 = (this->envl_x->keys).
            super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].time;
    if ((double)CONCAT44(uVar13,uVar12) <= dVar1) {
      uVar12 = SUB84(dVar1,0);
      uVar13 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    dVar4 = (double)CONCAT44(uVar13,uVar12) * dVar4;
    uVar6 = (ulong)dVar4;
    uVar6 = (long)(dVar4 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
  }
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve(out,(uVar6 >> 1) + uVar6);
  pEVar3 = this->envl_y;
  pKVar7 = (this->envl_x->keys).
           super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->cur_x)._M_current = pKVar7;
  pKVar9 = (pEVar3->keys).super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->cur_y)._M_current = pKVar9;
  pKVar10 = (this->envl_z->keys).
            super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
            super__Vector_impl_data._M_start;
  (this->cur_z)._M_current = pKVar10;
  this->end_z = false;
  this->end_x = false;
  this->end_y = false;
  out_00 = (vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)0x0;
  do {
    fill.mTime = 0.0;
    fill.mValue.x = 0.0;
    fill.mValue.y = 0.0;
    fill.mValue.z = 0.0;
    dVar1 = pKVar7->time;
    dVar2 = pKVar9->time;
    uVar12 = SUB84(dVar2,0);
    uVar13 = (undefined4)((ulong)dVar2 >> 0x20);
    if (((dVar1 != dVar2) || (dVar1 != pKVar10->time)) || (NAN(dVar1) || NAN(pKVar10->time))) {
      if ((dVar2 < dVar1) || (((ulong)out_00 & 1) != 0)) {
        if ((this->end_y & 1U) != 0) {
          if (((ulong)out_00 & 1) != 0) {
            pKVar7 = pKVar10;
          }
          uVar12 = SUB84(pKVar7->time,0);
          uVar13 = (undefined4)((ulong)pKVar7->time >> 0x20);
        }
      }
      else {
        dVar2 = pKVar10->time;
        uVar12 = SUB84(dVar2,0);
        uVar13 = (undefined4)((ulong)dVar2 >> 0x20);
        if ((dVar1 < dVar2) || (this->end_z != false)) {
          uVar12 = SUB84(dVar1,0);
          uVar13 = (undefined4)((ulong)dVar1 >> 0x20);
        }
      }
      InterpolateTrack(this,out_00,&fill,(double)CONCAT44(uVar13,uVar12));
    }
    else {
      fill.mValue.y = pKVar9->value;
      fill.mValue.x = pKVar7->value;
      fill.mValue.z = pKVar10->value;
      fill.mTime = dVar1;
    }
    dVar1 = fill.mTime;
    pKVar11 = (pointer)&fill;
    std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::push_back(out,&fill);
    pKVar7 = (this->cur_x)._M_current;
    if (pKVar7->time <= dVar1) {
      if (pKVar7 == (this->envl_x->keys).
                    super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1) {
        this->end_x = true;
      }
      else {
        pKVar7 = pKVar7 + 1;
        (this->cur_x)._M_current = pKVar7;
      }
    }
    pKVar9 = (this->cur_y)._M_current;
    if (pKVar9->time <= dVar1) {
      if (pKVar9 == (this->envl_y->keys).
                    super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1) {
        this->end_y = true;
      }
      else {
        pKVar9 = pKVar9 + 1;
        (this->cur_y)._M_current = pKVar9;
      }
    }
    pKVar10 = (this->cur_z)._M_current;
    if (pKVar10->time <= dVar1) {
      pKVar11 = (this->envl_z->keys).
                super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
      if (pKVar10 == pKVar11) {
        this->end_z = true;
      }
      else {
        pKVar10 = pKVar10 + 1;
        (this->cur_z)._M_current = pKVar10;
      }
    }
    out_00 = (vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
             CONCAT71((int7)((ulong)pKVar11 >> 8),this->end_x);
  } while (((this->end_x != true) || (this->end_y != true)) || (this->end_z == false));
  if ((this->flags & 2) != 0) {
    for (paVar8 = (out->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        paVar8 != (out->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
                  super__Vector_impl_data._M_finish; paVar8 = paVar8 + 1) {
      paVar8->mTime = paVar8->mTime - this->first;
    }
  }
  std::_Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::~_Vector_base
            (&local_e8.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>)
  ;
  std::_Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::~_Vector_base
            (&local_a8.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>)
  ;
  std::_Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::~_Vector_base
            (&local_68.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>)
  ;
  return;
}

Assistant:

void AnimResolver::GetKeys(std::vector<aiVectorKey>& out,
    LWO::Envelope* _envl_x,
    LWO::Envelope* _envl_y,
    LWO::Envelope* _envl_z,
    unsigned int _flags)
{
    envl_x = _envl_x;
    envl_y = _envl_y;
    envl_z = _envl_z;
    flags  = _flags;

    // generate default channels if none are given
    LWO::Envelope def_x, def_y, def_z;
    LWO::Key key_dummy;
    key_dummy.time = 0.f;
    if ((envl_x && envl_x->type == LWO::EnvelopeType_Scaling_X) ||
        (envl_y && envl_y->type == LWO::EnvelopeType_Scaling_Y) ||
        (envl_z && envl_z->type == LWO::EnvelopeType_Scaling_Z)) {
        key_dummy.value = 1.f;
    }
    else key_dummy.value = 0.f;

    if (!envl_x) {
        envl_x = &def_x;
        envl_x->keys.push_back(key_dummy);
    }
    if (!envl_y) {
        envl_y = &def_y;
        envl_y->keys.push_back(key_dummy);
    }
    if (!envl_z) {
        envl_z = &def_z;
        envl_z->keys.push_back(key_dummy);
    }

    // guess how many keys we'll get
    size_t reserve;
    double sr = 1.;
    if (flags & AI_LWO_ANIM_FLAG_SAMPLE_ANIMS) {
        if (!sample_rate)
            sr = 100.f;
        else sr = sample_rate;
        sample_delta = 1.f / sr;

        reserve = (size_t)(
            std::max( envl_x->keys.rbegin()->time,
            std::max( envl_y->keys.rbegin()->time, envl_z->keys.rbegin()->time )) * sr);
    }
    else reserve = std::max(envl_x->keys.size(),std::max(envl_x->keys.size(),envl_z->keys.size()));
    out.reserve(reserve+(reserve>>1));

    // Iterate through all three arrays at once - it's tricky, but
    // rather interesting to implement.
    cur_x = envl_x->keys.begin();
    cur_y = envl_y->keys.begin();
    cur_z = envl_z->keys.begin();

    end_x = end_y = end_z = false;
    while (1) {

        aiVectorKey fill;

        if ((*cur_x).time == (*cur_y).time && (*cur_x).time == (*cur_z).time ) {

            // we have a keyframe for all of them defined .. this means
            // we don't need to interpolate here.
            fill.mTime = (*cur_x).time;

            fill.mValue.x = (*cur_x).value;
            fill.mValue.y = (*cur_y).value;
            fill.mValue.z = (*cur_z).value;

            // subsample animation track
            if (flags & AI_LWO_ANIM_FLAG_SAMPLE_ANIMS) {
                //SubsampleAnimTrack(out,cur_x, cur_y, cur_z, d, sample_delta);
            }
        }

        // Find key with lowest time value
        else if ((*cur_x).time <= (*cur_y).time && !end_x) {

            if ((*cur_z).time <= (*cur_x).time && !end_z) {
                InterpolateTrack(out,fill,(*cur_z).time);
            }
            else {
                InterpolateTrack(out,fill,(*cur_x).time);
            }
        }
        else if ((*cur_z).time <= (*cur_y).time && !end_y)  {
            InterpolateTrack(out,fill,(*cur_y).time);
        }
        else if (!end_y) {
            // welcome on the server, y
            InterpolateTrack(out,fill,(*cur_y).time);
        }
        else {
            // we have reached the end of at least 2 channels,
            // only one is remaining. Extrapolate the 2.
            if (end_y) {
                InterpolateTrack(out,fill,(end_x ? (*cur_z) : (*cur_x)).time);
            }
            else if (end_x) {
                InterpolateTrack(out,fill,(end_z ? (*cur_y) : (*cur_z)).time);
            }
            else { // if (end_z)
                InterpolateTrack(out,fill,(end_y ? (*cur_x) : (*cur_y)).time);
            }
        }
        double lasttime = fill.mTime;
        out.push_back(fill);

        if (lasttime >= (*cur_x).time) {
            if (cur_x != envl_x->keys.end()-1)
                ++cur_x;
            else end_x = true;
        }
        if (lasttime >= (*cur_y).time) {
            if (cur_y != envl_y->keys.end()-1)
                ++cur_y;
            else end_y = true;
        }
        if (lasttime >= (*cur_z).time) {
            if (cur_z != envl_z->keys.end()-1)
                ++cur_z;
            else end_z = true;
        }

        if( end_x && end_y && end_z ) /* finished? */
            break;
    }

    if (flags & AI_LWO_ANIM_FLAG_START_AT_ZERO) {
        for (std::vector<aiVectorKey>::iterator it = out.begin(); it != out.end(); ++it)
            (*it).mTime -= first;
    }
}